

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Data<4U> * read_standard_data<4u>(char *PATH,int interval,int *cnt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  int iVar3;
  void *__addr;
  Data<4U> *pDVar4;
  long lVar5;
  size_t sVar6;
  char *__s;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  stat buf;
  stat local_c0;
  undefined1 auVar9 [16];
  
  iVar3 = open(PATH,0);
  fstat(iVar3,&local_c0);
  *cnt = (int)(local_c0.st_size / (long)interval);
  sVar6 = local_c0.st_size;
  __addr = mmap((void *)0x0,local_c0.st_size,1,2,iVar3,0);
  close(iVar3);
  if (__addr == (void *)0xffffffffffffffff) {
    __s = "[ERROR] MMAP FAILED!";
  }
  else {
    iVar3 = *cnt;
    pDVar4 = (Data<4U> *)malloc((ulong)(uint)(iVar3 * 4));
    if (pDVar4 != (Data<4U> *)0x0) {
      if (0 < iVar3) {
        auVar12 = vpbroadcastq_avx512vl();
        auVar13 = vpbroadcastq_avx512vl();
        auVar1 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar2 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        lVar5 = 0;
        auVar14._8_8_ = 8;
        auVar14._0_8_ = 8;
        auVar14._16_8_ = 8;
        auVar14._24_8_ = 8;
        do {
          uVar7 = vpcmpuq_avx512vl(auVar2,auVar12,2);
          uVar7 = uVar7 & 0xf;
          uVar8 = vpcmpuq_avx512vl(auVar1,auVar12,2);
          uVar8 = uVar8 & 0xf;
          vpmullq_avx512vl(auVar2,auVar13);
          vpmullq_avx512vl(auVar1,auVar13);
          auVar9 = vpgatherqd_avx512vl(*(undefined8 *)((long)__addr + sVar6));
          auVar10._4_4_ = (uint)((byte)(uVar8 >> 1) & 1) * auVar9._4_4_;
          auVar10._0_4_ = (uint)((byte)uVar8 & 1) * auVar9._0_4_;
          auVar10._8_4_ = (uint)((byte)(uVar8 >> 2) & 1) * auVar9._8_4_;
          auVar10._12_4_ = (uint)(byte)(uVar8 >> 3) * auVar9._12_4_;
          auVar9 = vpgatherqd_avx512vl(*(undefined8 *)((long)__addr + (ulong)(uint)interval));
          auVar11._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar9._4_4_;
          auVar11._0_4_ = (uint)((byte)uVar7 & 1) * auVar9._0_4_;
          auVar11._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar9._8_4_;
          auVar11._12_4_ = (uint)(byte)(uVar7 >> 3) * auVar9._12_4_;
          auVar15._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar11;
          auVar15._16_16_ = ZEXT116(1) * auVar10;
          auVar15 = vmovdqu32_avx512vl(auVar15);
          *(undefined1 (*) [32])(pDVar4->str + lVar5) = auVar15;
          auVar2 = vpaddq_avx2(auVar2,auVar14);
          auVar1 = vpaddq_avx2(auVar1,auVar14);
          lVar5 = lVar5 + 0x20;
        } while ((ulong)(iVar3 + 7U >> 3) << 5 != lVar5);
      }
      munmap(__addr,local_c0.st_size);
      return pDVar4;
    }
    __s = "[ERROR] MALLOC FAILED!";
  }
  puts(__s);
  exit(-1);
}

Assistant:

Data<DATA_LEN>* read_standard_data(const char* PATH, int interval, int* cnt) {
	struct stat buf;
	// printf("Opening file...\n");
	int fd = open(PATH, O_RDONLY);
	fstat(fd, &buf);

	*cnt = buf.st_size / interval;
	uint8_t* raw_addr = (uint8_t*)mmap(NULL, buf.st_size, PROT_READ, MAP_PRIVATE, fd, 0);
	close(fd);
	if (raw_addr == MAP_FAILED) {
		printf("[ERROR] MMAP FAILED!\n");
		exit(-1);
	}

	int num = *cnt;
	void* raw_data = malloc(DATA_LEN * num);
	if (raw_data == NULL) {
		printf("[ERROR] MALLOC FAILED!\n");
		exit(-1);
	}

	Data<DATA_LEN>* data = reinterpret_cast<Data<DATA_LEN>*>(raw_data);
	for (int i = 0; i < num; i++)
		data[i] = *reinterpret_cast<Data<DATA_LEN>*>(raw_addr + interval * i);
	munmap(raw_addr, buf.st_size);
	return data;
}